

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string_view element_name,Message *descriptor,
          ErrorLocation location,string_view undefined_symbol)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  code *pcVar1;
  undefined4 uVar2;
  DescriptorBuilder *local_70;
  DescriptorBuilder *local_68;
  DescriptorBuilder **local_60;
  code *pcStack_58;
  DescriptorBuilder **local_50;
  code *pcStack_48;
  DescriptorBuilder **local_40;
  code *pcStack_38;
  
  if (this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) {
    if ((this->undefine_resolved_name_)._M_string_length == 0) {
      local_40 = &local_70;
      pcStack_38 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__0,std::__cxx11::string>
      ;
      pcVar1 = pcStack_38;
      pcStack_38._0_4_ = 0x148e01;
      uVar2 = pcStack_38._0_4_;
      pcStack_38 = pcVar1;
      goto LAB_00135319;
    }
  }
  else {
    local_50 = &local_70;
    pcStack_48 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1,std::__cxx11::string>
    ;
    make_error.invoker_._0_4_ = 0x148e6e;
    make_error.ptr_.obj = local_50;
    make_error.invoker_._4_4_ = 0;
    local_70 = this;
    AddError(this,element_name,descriptor,location,make_error);
    if ((this->undefine_resolved_name_)._M_string_length == 0) {
      return;
    }
  }
  local_60 = &local_70;
  pcStack_58 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__2,std::__cxx11::string>
  ;
  pcVar1 = pcStack_58;
  pcStack_58._0_4_ = 0x148f49;
  uVar2 = pcStack_58._0_4_;
  local_68 = this;
  pcStack_58 = pcVar1;
LAB_00135319:
  make_error_00.invoker_._0_4_ = uVar2;
  make_error_00.ptr_.obj = &local_70;
  make_error_00.invoker_._4_4_ = 0;
  local_70 = (DescriptorBuilder *)&undefined_symbol;
  AddError(this,element_name,descriptor,location,make_error_00);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorBuilder::AddNotDefinedError(
    const absl::string_view element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const absl::string_view undefined_symbol) {
  if (possible_undeclared_dependency_ == nullptr &&
      undefine_resolved_name_.empty()) {
    AddError(element_name, descriptor, location, [&] {
      return absl::StrCat("\"", undefined_symbol, "\" is not defined.");
    });
  } else {
    if (possible_undeclared_dependency_ != nullptr) {
      AddError(element_name, descriptor, location, [&] {
        return absl::StrCat("\"", possible_undeclared_dependency_name_,
                            "\" seems to be defined in \"",
                            possible_undeclared_dependency_->name(),
                            "\", which is not "
                            "imported by \"",
                            filename_,
                            "\".  To use it here, please "
                            "add the necessary import.");
      });
    }
    if (!undefine_resolved_name_.empty()) {
      AddError(element_name, descriptor, location, [&] {
        return absl::StrCat(
            "\"", undefined_symbol, "\" is resolved to \"",
            undefine_resolved_name_,
            "\", which is not defined. "
            "The innermost scope is searched first in name resolution. "
            "Consider using a leading '.'(i.e., \".",
            undefined_symbol, "\") to start from the outermost scope.");
      });
    }
  }
}